

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall
FormatterTest_FormatExplicitlyConvertibleToStringView_Test::TestBody
          (FormatterTest_FormatExplicitlyConvertibleToStringView_Test *this)

{
  explicitly_convertible_to_string_view *in_RCX;
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  fmt::v5::format<char[3],explicitly_convertible_to_string_view>
            (&local_28,(v5 *)"{}",(char (*) [3])&local_40,in_RCX);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo\"",
             "fmt::format(\"{}\", explicitly_convertible_to_string_view())",(char (*) [4])"foo",
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
               ,0x24e,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, FormatExplicitlyConvertibleToStringView) {
  EXPECT_EQ("foo", fmt::format("{}", explicitly_convertible_to_string_view()));
}